

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  pointer puVar2;
  char cVar3;
  bool bVar4;
  size_type sVar5;
  ostream *poVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  pointer spdu;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  Options opts;
  Assembler assembler;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  ofstream fout;
  undefined4 uStack_5ac;
  byte abStack_590 [480];
  array<unsigned_char,_892UL> buf;
  
  parseOptions(&opts,argc,argv);
  if (opts.nanomsg._M_string_length == 0) {
    if (opts.files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        opts.files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"No input specified");
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar8 = 1;
      goto LAB_0011616b;
    }
    std::
    make_unique<FileReader,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&buf);
  }
  else {
    std::make_unique<NanomsgReader,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buf);
  }
  plVar1 = (long *)CONCAT62(buf._M_elems._2_6_,CONCAT11(buf._M_elems[1],buf._M_elems[0]));
  util::mkdirp(&opts.out);
  ::assembler::Assembler::Assembler(&assembler);
LAB_00115f21:
  cVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,&buf);
  if (cVar3 != '\0') {
    if (opts.vcids._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto code_r0x00115f41;
    goto LAB_00115f65;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_assembler::VirtualChannel>,_std::_Select1st<std::pair<const_int,_assembler::VirtualChannel>_>,_std::less<int>,_std::allocator<std::pair<const_int,_assembler::VirtualChannel>_>_>
               *)&assembler);
  (**(code **)(*plVar1 + 8))();
  iVar8 = 0;
LAB_0011616b:
  Options::~Options(&opts);
  return iVar8;
code_r0x00115f41:
  _fout = (pointer)(CONCAT44(uStack_5ac,(uint)buf._M_elems[1]) & 0xffffffff0000003f);
  sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&opts.vcids,(key_type *)&fout);
  if (sVar5 != 0) {
LAB_00115f65:
    _fout = (pointer)&buf;
    ::assembler::Assembler::process(&spdus,&assembler,(VCDU *)&fout);
    puVar2 = spdus.
             super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (spdu = spdus.
                super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; spdu != puVar2; spdu = spdu + 1) {
      bVar4 = lrit::hasHeader<lrit::AnnotationHeader>
                        (&((spdu->_M_t).
                           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl)->m_)
      ;
      if (bVar4) {
        bVar4 = filter(&opts,spdu);
        if (!bVar4) {
          pcVar9 = "Writing: ";
          if (opts.dryrun != false) {
            pcVar9 = "Writing (dry run): ";
          }
          std::operator<<((ostream *)&std::cout,pcVar9);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                         &opts.out,"/");
          filename_abi_cxx11_(&local_5f0,spdu);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fout,&local_5f0);
          std::__cxx11::string::~string((string *)&local_5f0);
          std::__cxx11::string::~string((string *)&fout);
          poVar6 = std::operator<<((ostream *)&std::cout,(string *)&name);
          std::operator<<(poVar6," ");
          if (opts.dryrun == false) {
            std::ofstream::ofstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                       (string *)&name,_S_bin);
            std::ostream::write((char *)&fout,
                                *(long *)&(((spdu->_M_t).
                                            super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                                            .super__Head_base<0UL,_assembler::SessionPDU_*,_false>.
                                           _M_head_impl)->buf_).
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl);
            std::ofstream::close();
            if ((abStack_590[*(long *)(_fout + -0x18)] & 5) == 0) {
              std::ofstream::~ofstream
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout)
              ;
              goto LAB_001160ed;
            }
            poVar6 = std::operator<<((ostream *)&std::cout,"(");
            piVar7 = __errno_location();
            pcVar9 = strerror(*piVar7);
            poVar6 = std::operator<<(poVar6,pcVar9);
            poVar6 = std::operator<<(poVar6,")");
            std::endl<char,std::char_traits<char>>(poVar6);
            std::ofstream::~ofstream
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
          }
          else {
LAB_001160ed:
            poVar6 = std::operator<<((ostream *)&std::cout,"(");
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            poVar6 = std::operator<<(poVar6," bytes)");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    std::
    vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ::~vector(&spdus);
  }
  goto LAB_00115f21;
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);

  // Create packet reader depending on options
  std::unique_ptr<PacketReader> reader;
  if (!opts.nanomsg.empty()) {
    reader = std::make_unique<NanomsgReader>(opts.nanomsg);
  } else if (!opts.files.empty()) {
    reader = std::make_unique<FileReader>(opts.files);
  } else {
    std::cerr << "No input specified" << std::endl;
    return 1;
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Pass packets to packet assembler
  assembler::Assembler assembler;
  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    VCDU vcdu(buf);

    // Don't process VCDU if VCID was not specified
    if (!opts.vcids.empty() && opts.vcids.count(vcdu.getVCID()) == 0) {
      continue;
    }

    auto spdus = assembler.process(buf);
    for (auto& spdu : spdus) {

      // Skip stuff without filename
      if (!spdu->hasHeader<lrit::AnnotationHeader>()) {
        continue;
      }

      // Check if we should include this file
      if (filter(opts, spdu)) {
        continue;
      }

      if (opts.dryrun) {
        std::cout << "Writing (dry run): ";
      } else {
        std::cout << "Writing: ";
      }

      const auto name = opts.out + "/" + filename(spdu);
      std::cout << name << " ";

      if (!opts.dryrun) {
        std::ofstream fout(name, std::ofstream::binary);
        const auto& buf = spdu->get();
        fout.write((const char*)buf.data(), buf.size());
        fout.close();
        if (fout.fail()) {
          std::cout << "(" << strerror(errno) << ")" << std::endl;
          continue;
        }
      }

      std::cout << "(" << spdu->size() << " bytes)" << std::endl;
    }
  }
}